

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

void __thiscall luna::State::CallCFunction(State *this,Value *f,int expect_result)

{
  size_t *psVar1;
  CFunctionType p_Var2;
  anon_union_8_9_8deb4486_for_Value_0 *paVar3;
  uint uVar4;
  _List_node_base *p_Var5;
  Value *pVVar6;
  uint uVar7;
  int iVar8;
  Value *pVVar9;
  ulong uVar10;
  CallInfo callee;
  CallInfo local_50;
  
  CallInfo::CallInfo(&local_50);
  local_50.register_ = f + 1;
  local_50.func_ = f;
  local_50.expect_result_ = expect_result;
  p_Var5 = (_List_node_base *)operator_new(0x38);
  p_Var5[1]._M_next = (_List_node_base *)local_50.register_;
  p_Var5[1]._M_prev = (_List_node_base *)local_50.func_;
  p_Var5[2]._M_next = (_List_node_base *)local_50.instruction_;
  p_Var5[2]._M_prev = (_List_node_base *)local_50.end_;
  p_Var5[3]._M_next = (_List_node_base *)CONCAT44(local_50._36_4_,local_50.expect_result_);
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl
            ._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (f->field_0).cfunc_;
  (this->cfunc_error_).type_ = CFuntionErrorType_NoError;
  uVar4 = (*p_Var2)(this);
  uVar10 = (ulong)uVar4;
  CheckCFunctionError(this);
  pVVar6 = (Value *)0x0;
  if (0 < (int)uVar4) {
    pVVar6 = (this->stack_).top_ + -uVar10;
  }
  if (expect_result == -1) {
    pVVar9 = f;
    if (0 < (int)uVar4) {
      do {
        pVVar9->type_ = pVVar6->type_;
        paVar3 = &pVVar6->field_0;
        pVVar6 = pVVar6 + 1;
        f = pVVar9 + 1;
        pVVar9->field_0 = *paVar3;
        uVar4 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar4;
        pVVar9 = f;
      } while (uVar4 != 0);
    }
  }
  else {
    uVar7 = expect_result;
    if ((int)uVar4 < expect_result) {
      uVar7 = uVar4;
    }
    pVVar9 = f;
    if (0 < (int)uVar7) {
      do {
        pVVar9->type_ = pVVar6->type_;
        paVar3 = &pVVar6->field_0;
        pVVar6 = pVVar6 + 1;
        f = pVVar9 + 1;
        pVVar9->field_0 = *paVar3;
        uVar7 = uVar7 - 1;
        pVVar9 = f;
      } while (uVar7 != 0);
    }
    iVar8 = expect_result - uVar4;
    if (iVar8 != 0 && (int)uVar4 <= expect_result) {
      do {
        (f->field_0).obj_ = (GCObject *)0x0;
        f->type_ = ValueT_Nil;
        f = f + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  Stack::SetNewTop(&this->stack_,f);
  p_Var5 = (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
  psVar1 = &(this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl
            ._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var5);
  return;
}

Assistant:

void State::CallCFunction(Value *f, int expect_result)
    {
        // Push the c function CallInfo
        CallInfo callee;
        callee.register_ = f + 1;
        callee.func_ = f;
        callee.expect_result_ = expect_result;
        calls_.push_back(callee);

        // Call c function
        CFunctionType cfunc = f->cfunc_;
        ClearCFunctionError();
        int res_count = cfunc(this);
        CheckCFunctionError();

        Value *src = nullptr;
        if (res_count > 0)
            src = stack_.top_ - res_count;

        // Copy c function result to caller stack
        Value *dst = f;
        if (expect_result == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < res_count; ++i)
                *dst++ = *src++;
        }
        else
        {
            int count = std::min(expect_result, res_count);
            for (int i = 0; i < count; ++i)
                *dst++ = *src++;
            // Set all remain expect results to nil
            count = expect_result - res_count;
            for (int i = 0; i < count; ++i, ++dst)
                dst->SetNil();
        }

        // Set registers which after dst to nil
        // and set new stack top pointer
        stack_.SetNewTop(dst);

        // Pop the c function CallInfo
        calls_.pop_back();
    }